

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_asm.c
# Opt level: O0

void emit_asm(BuildCtx *ctx)

{
  uint uVar1;
  int type;
  int iVar2;
  long in_RDI;
  int n;
  BuildReloc *r;
  int32_t next;
  int32_t ofs;
  int rel;
  int i;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  uint in_stack_ffffffffffffffd8;
  BuildCtx *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar3;
  undefined4 in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  int iVar4;
  undefined4 in_stack_fffffffffffffff4;
  int iVar5;
  
  fprintf(*(FILE **)(in_RDI + 0x10),"\t.file \"buildvm_%s.dasc\"\n",*(undefined8 *)(in_RDI + 0x90));
  fprintf(*(FILE **)(in_RDI + 0x10),"\t.text\n");
  emit_asm_align((BuildCtx *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffcc);
  emit_asm_label((BuildCtx *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                 (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                 (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20),(int)in_stack_ffffffffffffffe0);
  if (*(int *)(in_RDI + 8) != 2) {
    fprintf(*(FILE **)(in_RDI + 0x10),".Lbegin:\n");
  }
  iVar4 = 0;
  for (iVar5 = 0; iVar5 < *(int *)(in_RDI + 0x40); iVar5 = iVar5 + 1) {
    iVar2 = *(int *)(*(long *)(in_RDI + 0x58) + (long)iVar5 * 0x10 + 8);
    iVar3 = *(int *)(*(long *)(in_RDI + 0x58) + (long)(iVar5 + 1) * 0x10 + 8);
    emit_asm_label((BuildCtx *)CONCAT44(iVar5,iVar4),(char *)CONCAT44(iVar2,iVar3),
                   (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20),(int)in_stack_ffffffffffffffe0);
    while( true ) {
      uVar1 = in_stack_ffffffffffffffd8 & 0xffffff;
      if (iVar4 < *(int *)(in_RDI + 0x44)) {
        uVar1 = CONCAT13(*(int *)(in_RDI + 0x98 + (long)iVar4 * 0xc) <= iVar3,
                         (int3)in_stack_ffffffffffffffd8);
      }
      in_stack_ffffffffffffffd8 = uVar1;
      if ((char)(in_stack_ffffffffffffffd8 >> 0x18) == '\0') break;
      in_stack_ffffffffffffffe0 = (BuildCtx *)(in_RDI + 0x98 + (long)iVar4 * 0xc);
      type = *(int *)&in_stack_ffffffffffffffe0->D - iVar2;
      if ((in_stack_ffffffffffffffe0->mode == BUILD_elfasm) ||
         ((*(int *)(in_RDI + 8) != 0 && (*(int *)(in_RDI + 8) != 2)))) {
        emit_asm_bytes((BuildCtx *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       (uint8_t *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
        emit_asm_reloc(in_stack_ffffffffffffffe0,type,
                       (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      }
      else {
        emit_asm_reloc_text(in_stack_ffffffffffffffe0,
                            (uint8_t *)CONCAT44(type,in_stack_ffffffffffffffd8),
                            in_stack_ffffffffffffffd4,
                            (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      }
      iVar2 = type + 4 + iVar2;
      iVar4 = iVar4 + 1;
    }
    emit_asm_bytes((BuildCtx *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   (uint8_t *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
  }
  fprintf(*(FILE **)(in_RDI + 0x10),"\n");
  iVar4 = *(int *)(in_RDI + 8);
  if (iVar4 == 0) {
    fprintf(*(FILE **)(in_RDI + 0x10),"\t.section .note.GNU-stack,\"\",@progbits\n");
  }
  else if (iVar4 != 1) {
    if (iVar4 == 2) {
      fprintf(*(FILE **)(in_RDI + 0x10),"\t.cstring\n\t.ascii \"%s\\0\"\n",
              *(undefined8 *)(in_RDI + 0x88));
    }
    goto LAB_0010d23c;
  }
  fprintf(*(FILE **)(in_RDI + 0x10),"\t.ident \"%s\"\n",*(undefined8 *)(in_RDI + 0x88));
LAB_0010d23c:
  fprintf(*(FILE **)(in_RDI + 0x10),"\n");
  return;
}

Assistant:

void emit_asm(BuildCtx *ctx)
{
  int i, rel;

  fprintf(ctx->fp, "\t.file \"buildvm_%s.dasc\"\n", ctx->dasm_arch);
#if LJ_ARCH_PPC64
  fprintf(ctx->fp, "\t.abiversion 2\n");
#endif
  fprintf(ctx->fp, "\t.text\n");
  emit_asm_align(ctx, 4);

#if LJ_TARGET_PS3
  emit_asm_label(ctx, ctx->beginsym, ctx->codesz, 0);
#else
  emit_asm_label(ctx, ctx->beginsym, 0, 0);
#endif
  if (ctx->mode != BUILD_machasm)
    fprintf(ctx->fp, ".Lbegin:\n");

#if LJ_TARGET_ARM && defined(__GNUC__) && !LJ_NO_UNWIND
  /* This should really be moved into buildvm_arm.dasc. */
#if LJ_ARCH_HASFPU
  fprintf(ctx->fp,
	  ".fnstart\n"
	  ".save {r5, r6, r7, r8, r9, r10, r11, lr}\n"
	  ".vsave {d8-d15}\n"
	  ".save {r4}\n"
	  ".pad #28\n");
#else
  fprintf(ctx->fp,
	  ".fnstart\n"
	  ".save {r4, r5, r6, r7, r8, r9, r10, r11, lr}\n"
	  ".pad #28\n");
#endif
#endif
#if LJ_TARGET_MIPS
  fprintf(ctx->fp, ".set nomips16\n.abicalls\n.set noreorder\n.set nomacro\n");
#endif

  for (i = rel = 0; i < ctx->nsym; i++) {
    int32_t ofs = ctx->sym[i].ofs;
    int32_t next = ctx->sym[i+1].ofs;
#if LJ_TARGET_ARM && defined(__GNUC__) && !LJ_NO_UNWIND && LJ_HASFFI
    if (!strcmp(ctx->sym[i].name, "lj_vm_ffi_call"))
      fprintf(ctx->fp,
	      ".globl lj_err_unwind_arm\n"
	      ".personality lj_err_unwind_arm\n"
	      ".fnend\n"
	      ".fnstart\n"
	      ".save {r4, r5, r11, lr}\n"
	      ".setfp r11, sp\n");
#endif
    emit_asm_label(ctx, ctx->sym[i].name, next - ofs, 1);
    while (rel < ctx->nreloc && ctx->reloc[rel].ofs <= next) {
      BuildReloc *r = &ctx->reloc[rel];
      int n = r->ofs - ofs;
#if LJ_TARGET_X86ORX64
      if (r->type != 0 &&
	  (ctx->mode == BUILD_elfasm || ctx->mode == BUILD_machasm)) {
	emit_asm_reloc_text(ctx, ctx->code+ofs, n, ctx->relocsym[r->sym]);
      } else {
	emit_asm_bytes(ctx, ctx->code+ofs, n);
	emit_asm_reloc(ctx, r->type, ctx->relocsym[r->sym]);
      }
      ofs += n+4;
#else
      emit_asm_wordreloc(ctx, ctx->code+ofs, n, ctx->relocsym[r->sym]);
      ofs += n;
#endif
      rel++;
    }
#if LJ_TARGET_X86ORX64
    emit_asm_bytes(ctx, ctx->code+ofs, next-ofs);
#else
    emit_asm_words(ctx, ctx->code+ofs, next-ofs);
#endif
  }

#if LJ_TARGET_ARM && defined(__GNUC__) && !LJ_NO_UNWIND
  fprintf(ctx->fp,
#if !LJ_HASFFI
	  ".globl lj_err_unwind_arm\n"
	  ".personality lj_err_unwind_arm\n"
#endif
	  ".fnend\n");
#endif

  fprintf(ctx->fp, "\n");
  switch (ctx->mode) {
  case BUILD_elfasm:
#if !(LJ_TARGET_PS3 || LJ_TARGET_PSVITA)
    fprintf(ctx->fp, "\t.section .note.GNU-stack,\"\"," ELFASM_PX "progbits\n");
#endif
#if LJ_TARGET_PPC && !LJ_TARGET_PS3 && !LJ_ABI_SOFTFP
    /* Hard-float ABI. */
    fprintf(ctx->fp, "\t.gnu_attribute 4, 1\n");
#endif
    /* fallthrough */
  case BUILD_coffasm:
    fprintf(ctx->fp, "\t.ident \"%s\"\n", ctx->dasm_ident);
    break;
  case BUILD_machasm:
    fprintf(ctx->fp,
      "\t.cstring\n"
      "\t.ascii \"%s\\0\"\n", ctx->dasm_ident);
    break;
  default:
    break;
  }
  fprintf(ctx->fp, "\n");
}